

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_actor::state_write(se_actor *this,xr_packet *packet)

{
  xr_packet *pxVar1;
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  xr_packet *local_18;
  xr_packet *packet_local;
  se_actor *this_local;
  
  local_18 = packet;
  packet_local = (xr_packet *)this;
  cse_alife_creature_actor::state_write(&this->super_cse_alife_creature_actor,packet);
  if (*(ushort *)
       &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28 < 0x80)
  {
    if (*(ushort *)
         &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28 < 0x7a
       ) {
      if ((*(ushort *)
            &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28 <
           0x65) ||
         (0x76 < *(ushort *)
                  &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.
                   field_0x28)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0xf7,"virtual void xray_re::se_actor::state_write(xr_packet &)");
      }
    }
    else {
      if (0x7c < *(ushort *)
                  &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.
                   field_0x28) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0xb1,"virtual void xray_re::se_actor::state_write(xr_packet &)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"se_actor");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CRandomTask");
      (*local_18->_vptr_xr_packet[8])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"object_collection")
      ;
      w_object_collection(local_18);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"object_collection");
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[8])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CRandomTask");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"object_collection")
      ;
      w_object_collection(local_18);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"object_collection");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CMinigames");
      (*local_18->_vptr_xr_packet[8])(local_18,2);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_38,"test_crowkiller",&local_39);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"CMGCrowKiller",&local_71);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_98,"valiable",&local_99);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CMGCrowKiller");
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[8])(local_18,0x3c);
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,4);
      (*local_18->_vptr_xr_packet[6])(local_18,0);
      (*local_18->_vptr_xr_packet[8])(local_18,10);
      (*local_18->_vptr_xr_packet[8])(local_18,100);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c0,"",&local_c1);
      (*pxVar1->_vptr_xr_packet[4])();
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      (*local_18->_vptr_xr_packet[10])();
      (*local_18->_vptr_xr_packet[8])(local_18,0);
      (*local_18->_vptr_xr_packet[8])(local_18,10);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CMGCrowKiller");
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,"test_shooting",&local_e9);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_110,"CMGShooting",&local_111);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,"valiable",&local_139);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_138);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CMGShooting");
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_160,"",&local_161);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_160);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"",&local_189);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_188);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b0,"nil",&local_1b1);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1d8,"nil",&local_1d9);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_200,"nil",&local_201);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_200);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_228,"nil",&local_229);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_228);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_250,"nil",&local_251);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_250);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator(&local_251);
      (*local_18->_vptr_xr_packet[10])();
      (*local_18->_vptr_xr_packet[8])();
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[6])(local_18,0);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_278,"nil",&local_279);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_278);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator(&local_279);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CMGShooting");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CMinigames");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"se_actor");
    }
  }
  else {
    if (0x80 < *(ushort *)
                &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28
       ) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0xaa,"virtual void xray_re::se_actor::state_write(xr_packet &)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"se_actor");
    (*local_18->_vptr_xr_packet[0xc])(local_18,0);
    cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"se_actor");
  }
  return;
}

Assistant:

void se_actor::state_write(xr_packet& packet)
{
	cse_alife_creature_actor::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		
		set_save_marker(packet, SM_SAVE, false, "se_actor");
		packet.w_bool(0);		//start_position_filled
		set_save_marker(packet, SM_SAVE, true, "se_actor");

	} else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_SAVE, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_SAVE, false, "CRandomTask");
		packet.w_u16(0);
		// CRandomTask's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");
		packet.w_u8(0);
		packet.w_u16(0);
		set_save_marker(packet, SM_SAVE, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_SAVE, false, "CMinigames");
		packet.w_u16(2);
		packet.w_sz("test_crowkiller");
		packet.w_sz("CMGCrowKiller");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGCrowKiller");
		packet.w_u8(0);
		packet.w_u16(60);
		packet.w_bool(false);
		packet.w_u8(4);
		packet.w_u32(0);
		packet.w_u16(10);
		packet.w_u16(100);
		packet.w_u8(0);
		packet.w_sz("");
		packet.w_u8(0);
		packet.w_u16(0);
		packet.w_u16(10);
		packet.w_u8(0);
		packet.w_bool(false);
		set_save_marker(packet, SM_SAVE, true, "CMGCrowKiller");

		packet.w_sz("test_shooting");
		packet.w_sz("CMGShooting");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGShooting");
		packet.w_sz("");
		packet.w_sz("");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_u8(1);
		packet.w_u16(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u32(0);
		packet.w_sz("nil");
		set_save_marker(packet, SM_SAVE, true, "CMGShooting");
		set_save_marker(packet, SM_SAVE, true, "CMinigames");

		set_save_marker(packet, SM_SAVE, true, "se_actor");
	} else if (m_version >= CSE_VERSION_2215 && m_version <= CSE_VERSION_SOC) {
		// stub
	} else {
		xr_not_implemented();
	}
}